

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::CompressionParameters> *
kj::_::tryParseAllExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers,
          CompressionParameters *manualConfig)

{
  undefined8 uVar1;
  bool bVar2;
  ArrayPtr<const_char> *pAVar3;
  char in_R8B;
  int iVar4;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  NullableValue<kj::CompressionParameters> _config5166;
  CompressionParameters local_120;
  CompressionParameters local_f8;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  NullableValue<kj::CompressionParameters> _finalConfig5167;
  NullableValue<kj::CompressionParameters> local_60;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&splitOffers,(_ *)offers.content.ptr,input,in_R8B);
  for (pAVar3 = splitOffers.builder.ptr; pAVar3 != splitOffers.builder.pos; pAVar3 = pAVar3 + 1) {
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)pAVar3->size_;
    splitParts((Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,(_ *)pAVar3->ptr,input_00,
               in_R8B);
    _config5166._0_8_ = anon_var_dwarf_a30c7e;
    _config5166.field_1._0_8_ = 0x12;
    bVar2 = ArrayPtr<const_char>::operator==
                      (splitOffer.builder.ptr,(ArrayPtr<const_char> *)&_config5166);
    iVar4 = 3;
    if (bVar2) {
      tryExtractParameters
                ((Maybe<kj::CompressionParameters> *)&_finalConfig5167,
                 (Vector<kj::ArrayPtr<const_char>_> *)&splitOffer.builder,false);
      NullableValue<kj::CompressionParameters>::NullableValue(&_config5166,&_finalConfig5167);
      uVar1 = _config5166.field_1._0_8_;
      iVar4 = 0;
      if (_config5166.isSet == true) {
        local_f8.outboundNoContextTakeover = (bool)_config5166.field_1._0_1_;
        local_f8.inboundNoContextTakeover = (bool)_config5166.field_1._1_1_;
        local_f8.outboundMaxWindowBits.ptr.isSet =
             _config5166.field_1.value.outboundMaxWindowBits.ptr.isSet;
        if (_config5166.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
          local_f8.outboundMaxWindowBits.ptr.field_1 =
               _config5166.field_1.value.outboundMaxWindowBits.ptr.field_1;
        }
        local_f8.inboundMaxWindowBits.ptr.isSet =
             _config5166.field_1.value.inboundMaxWindowBits.ptr.isSet;
        if (_config5166.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
          local_f8.inboundMaxWindowBits.ptr.field_1 =
               _config5166.field_1.value.inboundMaxWindowBits.ptr.field_1;
        }
        local_120.outboundNoContextTakeover = manualConfig->outboundNoContextTakeover;
        local_120.inboundNoContextTakeover = manualConfig->inboundNoContextTakeover;
        local_120.outboundMaxWindowBits.ptr.isSet = (manualConfig->outboundMaxWindowBits).ptr.isSet;
        if (local_120.outboundMaxWindowBits.ptr.isSet == true) {
          local_120.outboundMaxWindowBits.ptr.field_1 =
               (manualConfig->outboundMaxWindowBits).ptr.field_1;
        }
        local_120.inboundMaxWindowBits.ptr.isSet = (manualConfig->inboundMaxWindowBits).ptr.isSet;
        if (local_120.inboundMaxWindowBits.ptr.isSet == true) {
          local_120.inboundMaxWindowBits.ptr.field_1 =
               (manualConfig->inboundMaxWindowBits).ptr.field_1;
        }
        _config5166.field_1._0_8_ = uVar1;
        compareClientAndServerConfigs
                  ((Maybe<kj::CompressionParameters> *)&local_60,&local_f8,&local_120);
        NullableValue<kj::CompressionParameters>::NullableValue(&_finalConfig5167,&local_60);
        if (_finalConfig5167.isSet == true) {
          NullableValue<kj::CompressionParameters>::NullableValue
                    (&__return_storage_ptr__->ptr,&_finalConfig5167.field_1.value);
          iVar4 = 1;
        }
      }
    }
    ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffer.builder);
    if ((iVar4 != 3) && (iVar4 != 0)) goto LAB_00364790;
  }
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00364790:
  ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffers.builder);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseAllExtensionOffers(StringPtr offers,
    CompressionParameters manualConfig) {
  // Similar to `tryParseExtensionOffers()`, however, this function is called when parsing in
  // `MANUAL_COMPRESSION` mode. In some cases, the server's configuration might not support the
  // `server_no_context_takeover` or `server_max_window_bits` parameters. Essentially, this function
  // will look at all the client's offers, and accept the first one that it can support.
  //
  // We differentiate these functions because in `AUTOMATIC_COMPRESSION` mode, KJ can support these
  // server restricting compression parameters.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      KJ_IF_SOME(finalConfig, compareClientAndServerConfigs(config, manualConfig)) {
        // Found a compatible configuration between the server's config and client's offer.
        return kj::mv(finalConfig);
      }
    }
  }
  return kj::none;
}